

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit-handle-allocator.cc
# Opt level: O3

void handle_allocator_test(void)

{
  ulong *puVar1;
  unsigned_long uVar2;
  bool bVar3;
  uint uVar4;
  const_iterator __cbeg;
  unsigned_long *puVar5;
  size_t __i;
  long lVar6;
  unsigned_long *puVar7;
  unsigned_long *puVar8;
  iterator iVar9;
  int iVar10;
  unsigned_long uVar11;
  ulong uVar12;
  vector<unsigned_long,_std::allocator<unsigned_long>_> perm_handles;
  vector<unsigned_long,_std::allocator<unsigned_long>_> handles;
  HandleAllocator<unsigned_long> allocator;
  uint64_t handle_1;
  mt19937 engine;
  random_device seed_gen;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_27a8;
  iterator iStack_27a0;
  unsigned_long *local_2798;
  unsigned_long *local_2788;
  iterator iStack_2780;
  unsigned_long *local_2778;
  HandleAllocator<unsigned_long> local_2768;
  unsigned_long *local_2738;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2730;
  random_device local_13a8;
  
  std::random_device::random_device(&local_13a8);
  uVar4 = std::random_device::_M_getval();
  local_2730._M_x[0] = (unsigned_long)uVar4;
  lVar6 = 1;
  uVar12 = local_2730._M_x[0];
  do {
    uVar12 = (ulong)(((uint)(uVar12 >> 0x1e) ^ (uint)uVar12) * 0x6c078965 + (int)lVar6);
    local_2730._M_x[lVar6] = uVar12;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_2730._M_p = 0x270;
  local_2798 = (unsigned_long *)0x0;
  local_27a8._M_current = (unsigned_long *)0x0;
  iStack_27a0._M_current = (unsigned_long *)0x0;
  local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2768.counter_ = 1;
  local_2768.dirty_ = true;
  lVar6 = 0x4000;
  do {
    if (local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      puVar5 = (unsigned_long *)local_2768.counter_;
      puVar7 = (unsigned_long *)(local_2768.counter_ + 1);
      if ((unsigned_long *)(local_2768.counter_ + 1) < (unsigned_long *)0x2) {
        iVar10 = 0;
        goto LAB_00116342;
      }
    }
    else {
      puVar1 = local_2768.freeList_.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
      local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish =
           local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + -1;
      local_2768.dirty_ = true;
      puVar5 = (unsigned_long *)*puVar1;
      puVar7 = (unsigned_long *)local_2768.counter_;
    }
    local_2768.counter_ = (unsigned_long)puVar7;
    local_2788 = puVar5;
    if (iStack_27a0._M_current == local_2798) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_27a8,iStack_27a0,
                 (unsigned_long *)&local_2788);
    }
    else {
      *iStack_27a0._M_current = (unsigned_long)puVar5;
      iStack_27a0._M_current = iStack_27a0._M_current + 1;
    }
    lVar6 = lVar6 + -1;
  } while (lVar6 != 0);
  iVar10 = 1;
LAB_00116342:
  acutest_check_(iVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x27,"%s","ok");
  acutest_check_((uint)(((long)local_2768.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2768.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) - local_2768.counter_
                       == -0x4001),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x28,"%s","allocator.Size() == n");
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (local_27a8,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )iStack_27a0._M_current,&local_2730);
  if (iStack_27a0._M_current == local_27a8._M_current) {
    uVar4 = 1;
  }
  else {
    uVar12 = 0;
    do {
      bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Has
                        (&local_2768,local_27a8._M_current[uVar12]);
      if (!bVar3) break;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_27a0._M_current - (long)local_27a8._M_current >> 3));
    uVar4 = (uint)bVar3;
  }
  acutest_check_(uVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x35,"%s","ok");
  if (iStack_27a0._M_current == local_27a8._M_current) {
    uVar4 = 1;
  }
  else {
    uVar12 = 0;
    do {
      bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Release
                        (&local_2768,local_27a8._M_current[uVar12]);
      if (!bVar3) break;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_27a0._M_current - (long)local_27a8._M_current >> 3));
    uVar4 = (uint)bVar3;
  }
  acutest_check_(uVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x41,"%s","ok");
  acutest_check_((uint)((unsigned_long *)local_2768.counter_ ==
                       (unsigned_long *)
                       (((long)local_2768.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2768.freeList_.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3) + 1U)),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x43,"%s","allocator.Size() == 0");
  if (iStack_27a0._M_current == local_27a8._M_current) {
    uVar4 = 1;
  }
  else {
    uVar12 = 0;
    do {
      bVar3 = tinyusdz::HandleAllocator<unsigned_long>::Has
                        (&local_2768,local_27a8._M_current[uVar12]);
      if (bVar3) break;
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_27a0._M_current - (long)local_27a8._M_current >> 3));
    uVar4 = (uint)!bVar3;
  }
  acutest_check_(uVar4,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x4e,"%s","ok");
  local_2788 = (unsigned_long *)0x0;
  iStack_2780._M_current = (unsigned_long *)0x0;
  local_2778 = (unsigned_long *)0x0;
  iVar10 = 1;
  if (iStack_27a0._M_current != local_27a8._M_current) {
    uVar12 = 0;
    do {
      if (local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_start ==
          local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        puVar5 = (unsigned_long *)local_2768.counter_;
        puVar7 = (unsigned_long *)(local_2768.counter_ + 1);
        if ((unsigned_long *)(local_2768.counter_ + 1) < (unsigned_long *)0x2) {
          iVar10 = 0;
          break;
        }
      }
      else {
        puVar1 = local_2768.freeList_.
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1;
        local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish + -1;
        local_2768.dirty_ = true;
        puVar5 = (unsigned_long *)*puVar1;
        puVar7 = (unsigned_long *)local_2768.counter_;
      }
      local_2768.counter_ = (unsigned_long)puVar7;
      local_2738 = puVar5;
      if (iStack_2780._M_current == local_2778) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_2788,iStack_2780,
                   (unsigned_long *)&local_2738);
      }
      else {
        *iStack_2780._M_current = (unsigned_long)puVar5;
        iStack_2780._M_current = iStack_2780._M_current + 1;
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 < (ulong)((long)iStack_27a0._M_current - (long)local_27a8._M_current >> 3));
  }
  acutest_check_(iVar10,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x5b,"%s","ok");
  iVar9._M_current = iStack_2780._M_current;
  puVar5 = local_2788;
  if (local_2788 != iStack_2780._M_current) {
    uVar12 = (long)iStack_2780._M_current - (long)local_2788 >> 3;
    lVar6 = 0x3f;
    if (uVar12 != 0) {
      for (; uVar12 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_2788,iStack_2780._M_current,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (puVar5,iVar9._M_current);
  }
  acutest_check_((uint)(*local_2788 == 1),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x5f,"%s","handles.front() == 1");
  acutest_check_((uint)(iStack_2780._M_current[-1] == 0x4000),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,0x61,"%s","last == n");
  iVar9._M_current = local_2788;
  if (local_2788 != iStack_2780._M_current) {
    puVar5 = local_2788 + 1;
    do {
      puVar7 = puVar5;
      iVar9._M_current = iStack_2780._M_current;
      if (puVar7 == iStack_2780._M_current) goto LAB_001166fa;
      puVar5 = puVar7 + 1;
    } while (puVar7[-1] != *puVar7);
    puVar8 = puVar7 + -1;
    uVar11 = puVar7[-1];
    for (; puVar5 != iStack_2780._M_current; puVar5 = puVar5 + 1) {
      uVar2 = *puVar5;
      if (uVar11 != uVar2) {
        puVar8[1] = uVar2;
        puVar8 = puVar8 + 1;
      }
      uVar11 = uVar2;
    }
    puVar8 = puVar8 + 1;
    if (puVar8 != iStack_2780._M_current) {
      iVar9._M_current = puVar8;
      iStack_2780._M_current = puVar8;
    }
  }
LAB_001166fa:
  acutest_check_((uint)((long)iVar9._M_current - (long)local_2788 ==
                       (long)iStack_27a0._M_current - (long)local_27a8._M_current),
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/tests/unit/unit-handle-allocator.cc"
                 ,99,"%s","handles.size() == perm_handles.size()");
  if (local_2788 != (unsigned_long *)0x0) {
    operator_delete(local_2788,(long)local_2778 - (long)local_2788);
  }
  if (local_2768.freeList_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2768.freeList_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2768.freeList_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2768.freeList_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_27a8._M_current != (unsigned_long *)0x0) {
    operator_delete(local_27a8._M_current,(long)local_2798 - (long)local_27a8._M_current);
  }
  std::random_device::_M_fini();
  return;
}

Assistant:

void handle_allocator_test(void) {

  std::random_device seed_gen;
  std::mt19937 engine(seed_gen());

  uint64_t n = 1024*16;

  std::vector<uint64_t> perm_handles;

  HandleAllocator<uint64_t> allocator;

  bool ok = true;
  for (size_t i = 0; i < n; i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break; 
    }

    perm_handles.push_back(handle);
  }
  TEST_CHECK(ok);
  TEST_CHECK(allocator.Size() == n);

  std::shuffle(perm_handles.begin(), perm_handles.end(), engine);

  // handle should exist
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "handle = " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  //std::cout << "del \n";
  // delete
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "del handle " << perm_handles[i] << ", Size = " << allocator.Size() << "\n";
    if (!allocator.Release(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);
  //std::cout << "del done\n";
  TEST_CHECK(allocator.Size() == 0);
  
  // no handle exists
  ok = true;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    //std::cout << "has handle " << perm_handles[i] << " = " << allocator.Has(perm_handles[i]) << "\n";
    if (allocator.Has(perm_handles[i])) {
      ok = false;
      break;
    }
  }
  TEST_CHECK(ok);

  // reallocate test
  ok = true;
  std::vector<uint64_t> handles;
  for (size_t i = 0; i < perm_handles.size(); i++) {
    uint64_t handle;
    if (!allocator.Allocate(&handle)) {
      ok = false;
      break;
    }
    handles.push_back(handle);
  }
  TEST_CHECK(ok);
  // uniqueness check
  std::sort(handles.begin(), handles.end());
  // array items = [1, ..., n]
  TEST_CHECK(handles.front() == 1); 
  uint64_t &last = handles.back();
  TEST_CHECK(last == n);
  handles.erase(std::unique(handles.begin(), handles.end()), handles.end());
  TEST_CHECK(handles.size() == perm_handles.size());


}